

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strangsplitting.cc
# Opt level: O3

VectorXd __thiscall FisherKPP::StrangSplit::Evolution(StrangSplit *this,VectorXd *cap,VectorXd *mu)

{
  double *pdVar1;
  _func_int **pp_Var2;
  double dVar3;
  _func_int **pp_Var4;
  double *pdVar5;
  double *pdVar6;
  double *pdVar7;
  _func_int *p_Var8;
  StrangSplit *dst;
  double *pdVar9;
  Index IVar10;
  uint uVar11;
  long *plVar12;
  ulong uVar13;
  long lVar14;
  long lVar15;
  element_type *peVar16;
  element_type *peVar17;
  Index extraout_RDX;
  ActualDstType actualDst;
  double __tmp;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  VectorXd VVar23;
  VectorXd sol_next;
  VectorXd sol_cur;
  VectorXd ones;
  scalar_product_op<double,_double> local_251;
  StrangSplit *local_250;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_248;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_238;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_228;
  uint local_20c;
  VectorXd *local_208;
  undefined8 uStack_200;
  scalar_constant_op<double> local_1f0;
  CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
  local_1e8;
  VectorXd *local_1d0;
  undefined1 local_1c8 [40];
  RhsNested local_1a0;
  RhsNested local_190;
  scalar_constant_op<double> local_170;
  CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
  local_150;
  StorageIndex *local_138;
  Index IStack_130;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
  local_120;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
  local_f0;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  local_88;
  
  local_208 = mu;
  plVar12 = (long *)(**(code **)(*(long *)(cap->
                                          super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                          ).m_storage.m_rows + 8))();
  uVar11 = (**(code **)(*plVar12 + 0x10))(plVar12);
  this->_vptr_StrangSplit = (_func_int **)0x0;
  (this->fe_space_).
  super___shared_ptr<lf::uscalfe::UniformScalarFESpace<double>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  uVar13 = (ulong)uVar11;
  local_250 = this;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)this,uVar13);
  local_238.m_storage.m_data = (double *)0x0;
  local_238.m_storage.m_rows = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize(&local_238,uVar13);
  local_248.m_storage.m_data = (double *)0x0;
  local_248.m_storage.m_rows = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize(&local_248,uVar13);
  local_f0.m_lhs = (LhsNested)0x3ff0000000000000;
  Eigen::
  CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>
  ::CwiseNullaryOp((CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                    *)local_1c8,uVar13,1,(scalar_constant_op<double> *)&local_f0);
  local_228.m_storage.m_data = (double *)0x0;
  local_228.m_storage.m_rows = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            (&local_228,local_1c8._0_8_,1);
  Eigen::internal::
  resize_if_allowed<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>>,double,double>
            ((Matrix<double,__1,_1,_0,__1,_1> *)&local_228,
             (CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
              *)local_1c8,(assign_op<double,_double> *)&local_f0);
  auVar20 = _DAT_003a2020;
  auVar19 = _DAT_003a2010;
  if (0 < local_228.m_storage.m_rows) {
    uVar13 = local_228.m_storage.m_rows + 0x1fffffffffffffffU & 0x1fffffffffffffff;
    auVar18._8_4_ = (int)uVar13;
    auVar18._0_8_ = uVar13;
    auVar18._12_4_ = (int)(uVar13 >> 0x20);
    lVar14 = 0;
    auVar18 = auVar18 ^ _DAT_003a2020;
    do {
      auVar22._8_4_ = (int)lVar14;
      auVar22._0_8_ = lVar14;
      auVar22._12_4_ = (int)((ulong)lVar14 >> 0x20);
      auVar22 = (auVar22 | auVar19) ^ auVar20;
      if ((bool)(~(auVar22._4_4_ == auVar18._4_4_ && auVar18._0_4_ < auVar22._0_4_ ||
                  auVar18._4_4_ < auVar22._4_4_) & 1)) {
        local_228.m_storage.m_data[lVar14] = (double)local_1c8._16_8_;
      }
      if ((auVar22._12_4_ != auVar18._12_4_ || auVar22._8_4_ <= auVar18._8_4_) &&
          auVar22._12_4_ <= auVar18._12_4_) {
        local_228.m_storage.m_data[lVar14 + 1] = (double)local_1c8._16_8_;
      }
      lVar14 = lVar14 + 2;
    } while ((uVar13 - ((uint)(local_228.m_storage.m_rows + 0x1fffffffffffffffU) & 1)) + 2 != lVar14
            );
  }
  diffusionEvolutionOperator((StrangSplit *)local_1c8,SUB81(cap,0),(VectorXd *)0x1);
  IVar10 = local_238.m_storage.m_rows;
  pdVar5 = local_238.m_storage.m_data;
  local_238.m_storage.m_data = (double *)local_1c8._0_8_;
  local_238.m_storage.m_rows = local_1c8._8_8_;
  local_1c8._0_8_ = pdVar5;
  local_1c8._8_8_ = IVar10;
  free(pdVar5);
  if (*(int *)&cap[2].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
               m_data - 3U < 0xfffffffe) {
    uVar11 = 1;
    local_1d0 = cap;
    do {
      local_20c = uVar11;
      Eigen::
      CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>
      ::CwiseBinaryOp(&local_150,local_208,(Rhs *)&local_238,
                      (scalar_quotient_op<double,_double> *)&local_1e8);
      Eigen::
      CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>
      ::CwiseBinaryOp(&local_120,&local_150,(Rhs *)&local_228,
                      (scalar_difference_op<double,_double> *)&local_1e8);
      local_1f0.m_other =
           exp(-(double)cap[3].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                        m_storage.m_data *
               (double)cap[2].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                       m_storage.m_rows);
      Eigen::
      CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>
      ::CwiseNullaryOp(&local_1e8,
                       ((local_120.m_rhs)->
                       super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                       m_rows,1,&local_1f0);
      Eigen::
      CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
      ::CwiseBinaryOp(&local_88,&local_120,&local_1e8,&local_251);
      Eigen::
      CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>_>
      ::CwiseBinaryOp(&local_f0,(Lhs *)&local_228,&local_88,
                      (scalar_sum_op<double,_double> *)&local_1e8);
      Eigen::
      CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>_>_>
      ::CwiseBinaryOp((CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>_>
                       *)local_1c8,local_208,&local_f0,
                      (scalar_quotient_op<double,_double> *)&local_1e8);
      dVar3 = *(double *)local_1c8._0_8_;
      pp_Var4 = ((ScalarFESpace<double> *)local_1c8._8_8_)->_vptr_ScalarFESpace;
      pdVar5 = (((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_1c8._32_8_)->
               m_storage).m_data;
      pdVar6 = (local_1a0->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage
               .m_data;
      pdVar7 = (local_190->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage
               .m_data;
      local_138 = (StorageIndex *)local_170.m_other;
      IStack_130 = 0;
      Eigen::internal::
      resize_if_allowed<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const>const>const>,double,double>
                ((Matrix<double,__1,_1,_0,__1,_1> *)&local_248,
                 (CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>_>
                  *)local_1c8,(assign_op<double,_double> *)&local_1e8);
      pdVar9 = local_248.m_storage.m_data;
      uVar13 = local_248.m_storage.m_rows - (local_248.m_storage.m_rows >> 0x3f) &
               0xfffffffffffffffe;
      if (1 < local_248.m_storage.m_rows) {
        lVar14 = 0;
        do {
          auVar19 = divpd(*(undefined1 (*) [16])(pdVar5 + lVar14),
                          *(undefined1 (*) [16])(pdVar6 + lVar14));
          pdVar1 = pdVar7 + lVar14;
          pp_Var2 = pp_Var4 + lVar14;
          auVar20._0_8_ = (auVar19._0_8_ - *pdVar1) * (double)local_138 + (double)*pp_Var2;
          auVar20._8_8_ = (auVar19._8_8_ - pdVar1[1]) * (double)local_138 + (double)pp_Var2[1];
          auVar19 = divpd(*(undefined1 (*) [16])((long)dVar3 + lVar14 * 8),auVar20);
          *(undefined1 (*) [16])(local_248.m_storage.m_data + lVar14) = auVar19;
          lVar14 = lVar14 + 2;
        } while (lVar14 < (long)uVar13);
      }
      if ((long)uVar13 < local_248.m_storage.m_rows) {
        lVar14 = local_248.m_storage.m_rows / 2;
        lVar15 = 0;
        do {
          local_248.m_storage.m_data[lVar14 * 2 + lVar15] =
               *(double *)((long)dVar3 + lVar14 * 0x10 + lVar15 * 8) /
               ((pdVar5[lVar14 * 2 + lVar15] / pdVar6[lVar14 * 2 + lVar15] -
                pdVar7[lVar14 * 2 + lVar15]) * (double)local_138 +
               (double)pp_Var4[lVar14 * 2 + lVar15]);
          lVar15 = lVar15 + 1;
        } while (local_248.m_storage.m_rows % 2 != lVar15);
      }
      Eigen::internal::
      resize_if_allowed<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Matrix<double,_1,1,0,_1,1>,double,double>
                ((Matrix<double,__1,_1,_0,__1,_1> *)&local_238,
                 (Matrix<double,__1,_1,_0,__1,_1> *)&local_248,
                 (assign_op<double,_double> *)local_1c8);
      cap = local_1d0;
      peVar16 = (element_type *)
                (local_238.m_storage.m_rows - (local_238.m_storage.m_rows >> 0x3f) &
                0xfffffffffffffffe);
      if (1 < local_238.m_storage.m_rows) {
        lVar14 = 0;
        do {
          pdVar5 = pdVar9 + lVar14;
          dVar3 = pdVar5[1];
          local_238.m_storage.m_data[lVar14] = *pdVar5;
          (local_238.m_storage.m_data + lVar14)[1] = dVar3;
          lVar14 = lVar14 + 2;
        } while (lVar14 < (long)peVar16);
      }
      if ((long)peVar16 < local_238.m_storage.m_rows) {
        do {
          local_238.m_storage.m_data[(long)peVar16] = pdVar9[(long)peVar16];
          peVar16 = (element_type *)
                    ((long)&(peVar16->super_ScalarFESpace<double>)._vptr_ScalarFESpace + 1);
        } while ((element_type *)local_238.m_storage.m_rows != peVar16);
      }
      diffusionEvolutionOperator((StrangSplit *)local_1c8,SUB81(local_1d0,0),(VectorXd *)0x0);
      IVar10 = local_248.m_storage.m_rows;
      pdVar5 = local_248.m_storage.m_data;
      local_248.m_storage.m_data = (double *)local_1c8._0_8_;
      local_248.m_storage.m_rows = local_1c8._8_8_;
      local_1c8._0_8_ = pdVar5;
      local_1c8._8_8_ = IVar10;
      free(pdVar5);
      pdVar5 = local_248.m_storage.m_data;
      Eigen::internal::
      resize_if_allowed<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Matrix<double,_1,1,0,_1,1>,double,double>
                ((Matrix<double,__1,_1,_0,__1,_1> *)&local_238,
                 (Matrix<double,__1,_1,_0,__1,_1> *)&local_248,
                 (assign_op<double,_double> *)local_1c8);
      peVar16 = (element_type *)
                (local_238.m_storage.m_rows - (local_238.m_storage.m_rows >> 0x3f) &
                0xfffffffffffffffe);
      if (1 < local_238.m_storage.m_rows) {
        lVar14 = 0;
        do {
          pdVar6 = pdVar5 + lVar14;
          dVar3 = pdVar6[1];
          local_238.m_storage.m_data[lVar14] = *pdVar6;
          (local_238.m_storage.m_data + lVar14)[1] = dVar3;
          lVar14 = lVar14 + 2;
        } while (lVar14 < (long)peVar16);
      }
      if ((long)peVar16 < local_238.m_storage.m_rows) {
        do {
          local_238.m_storage.m_data[(long)peVar16] = pdVar5[(long)peVar16];
          peVar16 = (element_type *)
                    ((long)&(peVar16->super_ScalarFESpace<double>)._vptr_ScalarFESpace + 1);
        } while ((element_type *)local_238.m_storage.m_rows != peVar16);
      }
      uVar11 = local_20c + 1;
    } while (uVar11 < *(int *)&cap[2].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                               .m_storage.m_data - 1U);
  }
  Eigen::
  CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>
  ::CwiseBinaryOp(&local_150,local_208,(Rhs *)&local_238,
                  (scalar_quotient_op<double,_double> *)&local_1e8);
  Eigen::
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>
  ::CwiseBinaryOp(&local_120,&local_150,(Rhs *)&local_228,
                  (scalar_difference_op<double,_double> *)&local_1e8);
  local_1f0.m_other =
       exp((double)cap[2].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                   m_rows *
           (double)cap[3].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                   m_data * -0.5);
  Eigen::
  CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>
  ::CwiseNullaryOp(&local_1e8,
                   ((local_120.m_rhs)->
                   super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows,
                   1,&local_1f0);
  Eigen::
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
  ::CwiseBinaryOp(&local_88,&local_120,&local_1e8,&local_251);
  Eigen::
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>_>
  ::CwiseBinaryOp(&local_f0,(Lhs *)&local_228,&local_88,(scalar_sum_op<double,_double> *)&local_1e8)
  ;
  Eigen::
  CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>_>_>
  ::CwiseBinaryOp((CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>_>
                   *)local_1c8,local_208,&local_f0,(scalar_quotient_op<double,_double> *)&local_1e8)
  ;
  dVar3 = *(double *)local_1c8._0_8_;
  pp_Var4 = ((ScalarFESpace<double> *)local_1c8._8_8_)->_vptr_ScalarFESpace;
  pdVar5 = (((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_1c8._32_8_)->
           m_storage).m_data;
  pdVar6 = (local_1a0->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
           m_data;
  pdVar7 = (local_190->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
           m_data;
  local_208 = (VectorXd *)local_170.m_other;
  uStack_200 = 0;
  Eigen::internal::
  resize_if_allowed<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const>const>const>,double,double>
            ((Matrix<double,__1,_1,_0,__1,_1> *)&local_248,
             (CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>_>
              *)local_1c8,(assign_op<double,_double> *)&local_1e8);
  pdVar9 = local_248.m_storage.m_data;
  dst = local_250;
  uVar13 = local_248.m_storage.m_rows - (local_248.m_storage.m_rows >> 0x3f) & 0xfffffffffffffffe;
  if (1 < local_248.m_storage.m_rows) {
    lVar14 = 0;
    do {
      auVar19 = divpd(*(undefined1 (*) [16])(pdVar5 + lVar14),
                      *(undefined1 (*) [16])(pdVar6 + lVar14));
      pdVar1 = pdVar7 + lVar14;
      pp_Var2 = pp_Var4 + lVar14;
      auVar21._0_8_ = (auVar19._0_8_ - *pdVar1) * (double)local_208 + (double)*pp_Var2;
      auVar21._8_8_ = (auVar19._8_8_ - pdVar1[1]) * (double)local_208 + (double)pp_Var2[1];
      auVar19 = divpd(*(undefined1 (*) [16])((long)dVar3 + lVar14 * 8),auVar21);
      *(undefined1 (*) [16])(local_248.m_storage.m_data + lVar14) = auVar19;
      lVar14 = lVar14 + 2;
    } while (lVar14 < (long)uVar13);
  }
  if ((long)uVar13 < local_248.m_storage.m_rows) {
    lVar14 = local_248.m_storage.m_rows / 2;
    lVar15 = 0;
    do {
      local_248.m_storage.m_data[lVar14 * 2 + lVar15] =
           *(double *)((long)dVar3 + lVar14 * 0x10 + lVar15 * 8) /
           ((pdVar5[lVar14 * 2 + lVar15] / pdVar6[lVar14 * 2 + lVar15] - pdVar7[lVar14 * 2 + lVar15]
            ) * (double)local_208 + (double)pp_Var4[lVar14 * 2 + lVar15]);
      lVar15 = lVar15 + 1;
    } while (local_248.m_storage.m_rows % 2 != lVar15);
  }
  Eigen::internal::
  resize_if_allowed<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Matrix<double,_1,1,0,_1,1>,double,double>
            ((Matrix<double,__1,_1,_0,__1,_1> *)&local_238,
             (Matrix<double,__1,_1,_0,__1,_1> *)&local_248,(assign_op<double,_double> *)local_1c8);
  pdVar5 = local_238.m_storage.m_data;
  peVar16 = (element_type *)
            (local_238.m_storage.m_rows - (local_238.m_storage.m_rows >> 0x3f) & 0xfffffffffffffffe)
  ;
  if (1 < local_238.m_storage.m_rows) {
    lVar14 = 0;
    do {
      pdVar6 = pdVar9 + lVar14;
      dVar3 = pdVar6[1];
      local_238.m_storage.m_data[lVar14] = *pdVar6;
      (local_238.m_storage.m_data + lVar14)[1] = dVar3;
      lVar14 = lVar14 + 2;
    } while (lVar14 < (long)peVar16);
  }
  if ((long)peVar16 < local_238.m_storage.m_rows) {
    do {
      local_238.m_storage.m_data[(long)peVar16] = pdVar9[(long)peVar16];
      peVar16 = (element_type *)
                ((long)&(peVar16->super_ScalarFESpace<double>)._vptr_ScalarFESpace + 1);
    } while ((element_type *)local_238.m_storage.m_rows != peVar16);
  }
  Eigen::internal::
  resize_if_allowed<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Matrix<double,_1,1,0,_1,1>,double,double>
            ((Matrix<double,__1,_1,_0,__1,_1> *)dst,(Matrix<double,__1,_1,_0,__1,_1> *)&local_238,
             (assign_op<double,_double> *)local_1c8);
  pp_Var4 = dst->_vptr_StrangSplit;
  peVar16 = (dst->fe_space_).
            super___shared_ptr<lf::uscalfe::UniformScalarFESpace<double>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr;
  peVar17 = (element_type *)((long)peVar16 - ((long)peVar16 >> 0x3f) & 0xfffffffffffffffe);
  if (1 < (long)peVar16) {
    lVar14 = 0;
    do {
      pdVar6 = pdVar5 + lVar14;
      p_Var8 = (_func_int *)pdVar6[1];
      pp_Var2 = pp_Var4 + lVar14;
      *pp_Var2 = (_func_int *)*pdVar6;
      pp_Var2[1] = p_Var8;
      lVar14 = lVar14 + 2;
    } while (lVar14 < (long)peVar17);
  }
  if ((long)peVar17 < (long)peVar16) {
    do {
      pp_Var4[(long)peVar17] = (_func_int *)pdVar5[(long)peVar17];
      peVar17 = (element_type *)
                ((long)&(peVar17->super_ScalarFESpace<double>)._vptr_ScalarFESpace + 1);
    } while (peVar16 != peVar17);
  }
  free(local_228.m_storage.m_data);
  free(local_248.m_storage.m_data);
  free(local_238.m_storage.m_data);
  VVar23.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
       extraout_RDX;
  VVar23.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)dst;
  return (VectorXd)VVar23.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage;
}

Assistant:

Eigen::VectorXd StrangSplit::Evolution(const Eigen::VectorXd &cap,
                                       const Eigen::VectorXd &mu) {
  const lf::assemble::DofHandler &dofh{fe_space_->LocGlobMap()};
  const lf::uscalfe::size_type N_dofs(dofh.NumDofs());

  Eigen::VectorXd sol(N_dofs);
  Eigen::VectorXd sol_cur(N_dofs);
  Eigen::VectorXd sol_next(N_dofs);

  const Eigen::VectorXd ones = Eigen::VectorXd::Ones(N_dofs);

  /* Time Steps */
  // double tau = T_ / m_;

  /* Strang Splitting Method
   * First half time step [0, tau/2]: Diffusion
   */
  bool firstcall = true;
  sol_cur = StrangSplit::diffusionEvolutionOperator(firstcall, mu);
  firstcall = false;
  /* loop through time steps */
  for (unsigned int i = 1; i < m_ - 1; i++) {
    /* Reaction for next full time step */
    sol_next = cap.cwiseQuotient(ones + (cap.cwiseQuotient(sol_cur) - ones) *
                                            std::exp(-lambda_ * tau_));
    sol_cur = sol_next;
    /* Diffusion for next full time step */
    sol_next = StrangSplit::diffusionEvolutionOperator(firstcall, sol_cur);
    sol_cur = sol_next;
  }

  /* Last half time step: Reaction */
  sol_next = cap.cwiseQuotient(ones + (cap.cwiseQuotient(sol_cur) - ones) *
                                          std::exp(-lambda_ * tau_ / 2.));
  sol_cur = sol_next;

  sol = sol_cur;
  return sol;
}